

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O1

void draco::parser::SkipCharacters(DecoderBuffer *buffer,char *skip_chars)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  int64_t iVar6;
  ulong uVar7;
  
  if (skip_chars != (char *)0x0) {
    sVar4 = strlen(skip_chars);
    iVar3 = (int)sVar4;
    uVar5 = 1;
    iVar6 = buffer->pos_;
    if (1 < iVar3) {
      uVar5 = sVar4 & 0xffffffff;
    }
    while( true ) {
      lVar1 = iVar6 + 1;
      bVar2 = buffer->data_size_ < lVar1;
      if (!bVar2) {
        sVar4 = (size_t)(byte)buffer->data_[iVar6];
      }
      if (bVar2 || iVar3 < 1) break;
      uVar7 = 0;
      while ((char)sVar4 != skip_chars[uVar7]) {
        uVar7 = uVar7 + 1;
        if (uVar5 == uVar7) {
          return;
        }
      }
      buffer->pos_ = lVar1;
      iVar6 = lVar1;
    }
  }
  return;
}

Assistant:

void SkipCharacters(DecoderBuffer *buffer, const char *skip_chars) {
  if (skip_chars == nullptr) {
    return;
  }
  const int num_skip_chars = static_cast<int>(strlen(skip_chars));
  char c;
  while (buffer->Peek(&c)) {
    // Check all characters in the pattern.
    bool skip = false;
    for (int i = 0; i < num_skip_chars; ++i) {
      if (c == skip_chars[i]) {
        skip = true;
        break;
      }
    }
    if (!skip) {
      return;
    }
    buffer->Advance(1);
  }
}